

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

optional<int> GetPruneHeight(BlockManager *blockman,CChain *chain)

{
  pointer ppCVar1;
  pointer ppCVar2;
  CBlockIndex **ppCVar3;
  ulong uVar4;
  ulong uVar5;
  CBlockIndex *lower_block;
  CBlockIndex *upper_block;
  long in_FS_OFFSET;
  CBlockIndex *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar1 = (chain->vChain).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar2 = (chain->vChain).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)ppCVar2 - (long)ppCVar1;
  if ((int)(uVar5 >> 3) < 2) {
    lower_block = (CBlockIndex *)0x0;
  }
  else {
    lower_block = ppCVar1[1];
  }
  if ((ppCVar2 == ppCVar1) || (uVar4 = 0, lower_block == (CBlockIndex *)0x0)) {
LAB_007d1ef2:
    uVar4 = 0;
    uVar5 = 0;
  }
  else {
    upper_block = *(CBlockIndex **)((long)ppCVar1 + (uVar5 - 8));
    uVar5 = 0;
    if (upper_block == (CBlockIndex *)0x0) goto LAB_007d1ef4;
    if ((~upper_block->nStatus & 0x18) == 0) {
      local_18 = node::BlockManager::GetFirstBlock(blockman,upper_block,0x18,lower_block);
      ppCVar3 = inline_check_non_fatal<CBlockIndex_const*>
                          (&local_18,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp"
                           ,0x33f,"GetPruneHeight",
                           "blockman.GetFirstBlock(*chain_tip, BLOCK_HAVE_MASK, first_block)");
      if (*ppCVar3 == lower_block) goto LAB_007d1ef2;
      ppCVar3 = inline_check_non_fatal<CBlockIndex*const&>
                          (&(*ppCVar3)->pprev,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp"
                           ,0x346,"GetPruneHeight","first_unpruned.pprev");
      upper_block = *ppCVar3;
    }
    uVar5 = (ulong)(uint)upper_block->nHeight;
    uVar4 = 0x100000000;
  }
LAB_007d1ef4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return (optional<int>)(uVar4 | uVar5);
}

Assistant:

std::optional<int> GetPruneHeight(const BlockManager& blockman, const CChain& chain) {
    AssertLockHeld(::cs_main);

    // Search for the last block missing block data or undo data. Don't let the
    // search consider the genesis block, because the genesis block does not
    // have undo data, but should not be considered pruned.
    const CBlockIndex* first_block{chain[1]};
    const CBlockIndex* chain_tip{chain.Tip()};

    // If there are no blocks after the genesis block, or no blocks at all, nothing is pruned.
    if (!first_block || !chain_tip) return std::nullopt;

    // If the chain tip is pruned, everything is pruned.
    if (!((chain_tip->nStatus & BLOCK_HAVE_MASK) == BLOCK_HAVE_MASK)) return chain_tip->nHeight;

    const auto& first_unpruned{*CHECK_NONFATAL(blockman.GetFirstBlock(*chain_tip, /*status_mask=*/BLOCK_HAVE_MASK, first_block))};
    if (&first_unpruned == first_block) {
        // All blocks between first_block and chain_tip have data, so nothing is pruned.
        return std::nullopt;
    }

    // Block before the first unpruned block is the last pruned block.
    return CHECK_NONFATAL(first_unpruned.pprev)->nHeight;
}